

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadUSDZFromMemory
               (uint8_t *addr,size_t length,string *filename,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  string local_3c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0 [39];
  undefined1 local_379;
  uint8_t *puStack_378;
  bool ret_1;
  uint8_t *usda_addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350 [32];
  string local_330 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [32];
  size_t local_2f0;
  size_t usda_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8 [32];
  ulong local_2a8;
  size_t end_addr_offset_1;
  size_t start_addr_offset_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [39];
  undefined1 local_251;
  uint8_t *puStack_250;
  bool ret;
  uint8_t *usdc_addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  string local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [32];
  size_t local_1c8;
  size_t usdc_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [32];
  ulong local_180;
  size_t end_addr_offset;
  size_t start_addr_offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  anon_unknown_27 local_b0 [32];
  anon_unknown_27 local_90 [8];
  string ext;
  ulong local_70;
  size_t i;
  int iStack_60;
  bool warned;
  int32_t usda_index;
  int32_t usdc_index;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  assets;
  string *err_local;
  string *warn_local;
  Stage *stage_local;
  string *filename_local;
  size_t length_local;
  uint8_t *addr_local;
  
  assets.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  std::
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ::vector((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
            *)&usdc_index);
  bVar1 = anon_unknown_27::ParseUSDZHeader
                    (addr,length,
                     (vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                      *)&usdc_index,warn,
                     &(assets.
                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->filename);
  if (bVar1) {
    iStack_60 = -1;
    i._4_4_ = -1;
    bVar1 = false;
    for (local_70 = 0;
        sVar3 = std::
                vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                ::size((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                        *)&usdc_index), local_70 < sVar3; local_70 = local_70 + 1) {
      pvVar4 = std::
               vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                             *)&usdc_index,local_70);
      anon_unknown_27::GetFileExtension(local_b0,&pvVar4->filename);
      anon_unknown_27::str_tolower(local_90,(string *)local_b0);
      ::std::__cxx11::string::~string((string *)local_b0);
      iVar2 = ::std::__cxx11::string::compare((char *)local_90);
      if (iVar2 == 0) {
        if ((-1 < iStack_60) && (!bVar1)) {
          if (warn != (string *)0x0) {
            std::
            vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
            ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                          *)&usdc_index,(long)iStack_60);
            ::std::operator+((char *)local_f0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Multiple USDC files were found in USDZ. Use the first found one: ");
            ::std::operator+(local_d0,(char *)local_f0);
            ::std::__cxx11::string::operator+=((string *)warn,(string *)local_d0);
            ::std::__cxx11::string::~string((string *)local_d0);
            ::std::__cxx11::string::~string(local_f0);
          }
          bVar1 = true;
        }
        if (iStack_60 == -1) {
          iStack_60 = (int)local_70;
        }
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)local_90);
        if (iVar2 == 0) {
          if ((-1 < i._4_4_) && (!bVar1)) {
            if (warn != (string *)0x0) {
              std::
              vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                            *)&usdc_index,(long)i._4_4_);
              ::std::operator+((char *)local_130,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Multiple USDA files were found in USDZ. Use the first found one: ");
              ::std::operator+(local_110,(char *)local_130);
              ::std::__cxx11::string::operator+=((string *)warn,(string *)local_110);
              ::std::__cxx11::string::~string((string *)local_110);
              ::std::__cxx11::string::~string(local_130);
            }
            bVar1 = true;
          }
          if (i._4_4_ == -1) {
            i._4_4_ = (int)local_70;
          }
        }
      }
      ::std::__cxx11::string::~string((string *)local_90);
    }
    if ((iStack_60 == -1) && (i._4_4_ == -1)) {
      if (assets.
          super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::__cxx11::string::operator+=
                  ((string *)
                   assets.
                   super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "Neither USDC nor USDA file found in USDZ\n");
      }
      addr_local._7_1_ = false;
    }
    else {
      if ((-1 < iStack_60) && ((-1 < i._4_4_ && (warn != (string *)0x0)))) {
        std::
        vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
        ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                      *)&usdc_index,(long)iStack_60);
        ::std::operator+((char *)&start_addr_offset,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Both USDA and USDC file found. Use USDC file [");
        ::std::operator+(local_150,(char *)&start_addr_offset);
        ::std::__cxx11::string::operator+=((string *)warn,(string *)local_150);
        ::std::__cxx11::string::~string((string *)local_150);
        ::std::__cxx11::string::~string((string *)&start_addr_offset);
      }
      if (iStack_60 < 0) {
        if (-1 < i._4_4_) {
          pvVar4 = std::
                   vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                   ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                 *)&usdc_index,(long)i._4_4_);
          end_addr_offset_1 = pvVar4->byte_begin;
          pvVar4 = std::
                   vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                   ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                 *)&usdc_index,(long)i._4_4_);
          local_2a8 = pvVar4->byte_end;
          if (local_2a8 < end_addr_offset_1) {
            if (assets.
                super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              ::std::operator+((char *)&usda_size,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Invalid start/end offset to USDA data: [");
              ::std::operator+(local_2c8,(char *)&usda_size);
              ::std::__cxx11::string::operator+=
                        ((string *)
                         assets.
                         super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_2c8);
              ::std::__cxx11::string::~string((string *)local_2c8);
              ::std::__cxx11::string::~string((string *)&usda_size);
            }
            addr_local._7_1_ = false;
            goto LAB_0012c3d5;
          }
          local_2f0 = local_2a8 - end_addr_offset_1;
          if (length < end_addr_offset_1) {
            if (assets.
                super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              ::std::operator+((char *)local_330,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Invalid start offset to USDA data: [");
              ::std::operator+(local_310,(char *)local_330);
              ::std::__cxx11::string::operator+=
                        ((string *)
                         assets.
                         super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_310);
              ::std::__cxx11::string::~string((string *)local_310);
              ::std::__cxx11::string::~string(local_330);
            }
            addr_local._7_1_ = false;
            goto LAB_0012c3d5;
          }
          if (length < local_2a8) {
            if (assets.
                super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              ::std::operator+((char *)&usda_addr,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Invalid end offset to USDA data: [");
              ::std::operator+(local_350,(char *)&usda_addr);
              ::std::__cxx11::string::operator+=
                        ((string *)
                         assets.
                         super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_350);
              ::std::__cxx11::string::~string((string *)local_350);
              ::std::__cxx11::string::~string((string *)&usda_addr);
            }
            addr_local._7_1_ = false;
            goto LAB_0012c3d5;
          }
          puStack_378 = addr + end_addr_offset_1;
          local_379 = LoadUSDAFromMemory(puStack_378,local_2f0,filename,stage,warn,
                                         &(assets.
                                           super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          filename,options);
          if (!(bool)local_379) {
            if (assets.
                super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              ::std::operator+((char *)local_3c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Failed to load USDA: [");
              ::std::operator+(local_3a0,(char *)local_3c0);
              ::std::__cxx11::string::operator+=
                        ((string *)
                         assets.
                         super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_3a0);
              ::std::__cxx11::string::~string((string *)local_3a0);
              ::std::__cxx11::string::~string(local_3c0);
            }
            addr_local._7_1_ = false;
            goto LAB_0012c3d5;
          }
        }
      }
      else {
        pvVar4 = std::
                 vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                               *)&usdc_index,(long)iStack_60);
        end_addr_offset = pvVar4->byte_begin;
        pvVar4 = std::
                 vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                               *)&usdc_index,(long)iStack_60);
        local_180 = pvVar4->byte_end;
        if (local_180 < end_addr_offset) {
          if (assets.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::operator+((char *)&usdc_size,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Invalid start/end offset to USDC data: [");
            ::std::operator+(local_1a0,(char *)&usdc_size);
            ::std::__cxx11::string::operator+=
                      ((string *)
                       assets.
                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1a0);
            ::std::__cxx11::string::~string((string *)local_1a0);
            ::std::__cxx11::string::~string((string *)&usdc_size);
          }
          addr_local._7_1_ = false;
          goto LAB_0012c3d5;
        }
        local_1c8 = local_180 - end_addr_offset;
        if (length < end_addr_offset) {
          if (assets.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::operator+((char *)local_208,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Invalid start offset to USDC data: [");
            ::std::operator+(local_1e8,(char *)local_208);
            ::std::__cxx11::string::operator+=
                      ((string *)
                       assets.
                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1e8);
            ::std::__cxx11::string::~string((string *)local_1e8);
            ::std::__cxx11::string::~string(local_208);
          }
          addr_local._7_1_ = false;
          goto LAB_0012c3d5;
        }
        if (length < local_180) {
          if (assets.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::operator+((char *)&usdc_addr,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Invalid end offset to USDC data: [");
            ::std::operator+(local_228,(char *)&usdc_addr);
            ::std::__cxx11::string::operator+=
                      ((string *)
                       assets.
                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_228);
            ::std::__cxx11::string::~string((string *)local_228);
            ::std::__cxx11::string::~string((string *)&usdc_addr);
          }
          addr_local._7_1_ = false;
          goto LAB_0012c3d5;
        }
        puStack_250 = addr + end_addr_offset;
        local_251 = LoadUSDCFromMemory(puStack_250,local_1c8,filename,stage,warn,
                                       &(assets.
                                         super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        filename,options);
        if (!(bool)local_251) {
          if (assets.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::operator+((char *)&start_addr_offset_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Failed to load USDC: [");
            ::std::operator+(local_278,(char *)&start_addr_offset_1);
            ::std::__cxx11::string::operator+=
                      ((string *)
                       assets.
                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_278);
            ::std::__cxx11::string::~string((string *)local_278);
            ::std::__cxx11::string::~string((string *)&start_addr_offset_1);
          }
          addr_local._7_1_ = false;
          goto LAB_0012c3d5;
        }
      }
      addr_local._7_1_ = true;
    }
  }
  else {
    addr_local._7_1_ = false;
  }
LAB_0012c3d5:
  std::
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ::~vector((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
             *)&usdc_index);
  return addr_local._7_1_;
}

Assistant:

bool LoadUSDZFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &filename, Stage *stage,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  std::vector<USDZAssetInfo> assets;
  if (!ParseUSDZHeader(addr, length, &assets, warn, err)) {
    return false;
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i < assets.size(); i++) {
    DCOUT("[" << i << "] " << assets[i].filename << " : byte range ("
              << assets[i].byte_begin << ", " << assets[i].byte_end << ")");
  }
#endif

  int32_t usdc_index = -1;
  int32_t usda_index = -1;
  {
    bool warned = false;  // to report single warning message.
    for (size_t i = 0; i < assets.size(); i++) {
      std::string ext = str_tolower(GetFileExtension(assets[i].filename));
      if (ext.compare("usdc") == 0) {
        if ((usdc_index > -1) && (!warned)) {
          if (warn) {
            (*warn) +=
                "Multiple USDC files were found in USDZ. Use the first found "
                "one: " +
                assets[size_t(usdc_index)].filename + "]\n";
          }
          warned = true;
        }

        if (usdc_index == -1) {
          usdc_index = int32_t(i);
        }
      } else if (ext.compare("usda") == 0) {
        if ((usda_index > -1) && (!warned)) {
          if (warn) {
            (*warn) +=
                "Multiple USDA files were found in USDZ. Use the first found "
                "one: " +
                assets[size_t(usda_index)].filename + "]\n";
          }
          warned = true;
        }
        if (usda_index == -1) {
          usda_index = int32_t(i);
        }
      }
    }
  }

  if ((usdc_index == -1) && (usda_index == -1)) {
    if (err) {
      (*err) += "Neither USDC nor USDA file found in USDZ\n";
    }
    return false;
  }

  if ((usdc_index >= 0) && (usda_index >= 0)) {
    if (warn) {
      (*warn) += "Both USDA and USDC file found. Use USDC file [" +
                 assets[size_t(usdc_index)].filename + "]\n";
    }
  }

  if (usdc_index >= 0) {
    const size_t start_addr_offset = assets[size_t(usdc_index)].byte_begin;
    const size_t end_addr_offset = assets[size_t(usdc_index)].byte_end;
    if (end_addr_offset < start_addr_offset) {
      if (err) {
        (*err) +=
            "Invalid start/end offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }
    const size_t usdc_size = end_addr_offset - start_addr_offset;

    if (start_addr_offset > length) {
      if (err) {
        (*err) += "Invalid start offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }

    if (end_addr_offset > length) {
      if (err) {
        (*err) += "Invalid end offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }

    const uint8_t *usdc_addr = addr + start_addr_offset;
    bool ret = LoadUSDCFromMemory(usdc_addr, usdc_size, filename, stage, warn,
                                  err, options);

    if (!ret) {
      if (err) {
        (*err) += "Failed to load USDC: [" + filename + "].\n";
      }

      return false;
    }
  } else if (usda_index >= 0) {
    const size_t start_addr_offset = assets[size_t(usda_index)].byte_begin;
    const size_t end_addr_offset = assets[size_t(usda_index)].byte_end;
    if (end_addr_offset < start_addr_offset) {
      if (err) {
        (*err) +=
            "Invalid start/end offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }
    const size_t usda_size = end_addr_offset - start_addr_offset;

    if (start_addr_offset > length) {
      if (err) {
        (*err) += "Invalid start offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }

    if (end_addr_offset > length) {
      if (err) {
        (*err) += "Invalid end offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }

    const uint8_t *usda_addr = addr + start_addr_offset;
    bool ret = LoadUSDAFromMemory(usda_addr, usda_size, filename, stage, warn,
                                  err, options);

    if (!ret) {
      if (err) {
        (*err) += "Failed to load USDA: [" + filename + "].\n";
      }

      return false;
    }
  }

#if 0 // TODO: Remove
  // Decode images
  for (size_t i = 0; i < assets.size(); i++) {
    const std::string &uri = assets[i].filename;
    const std::string ext = GetFileExtension(uri);

    if ((ext.compare("png") == 0) || (ext.compare("jpg") == 0) ||
        (ext.compare("jpeg") == 0)) {
      const size_t start_addr_offset = assets[i].byte_begin;
      const size_t end_addr_offset = assets[i].byte_end;
      const size_t asset_size = end_addr_offset - start_addr_offset;
      const uint8_t *asset_addr = addr + start_addr_offset;

      if (end_addr_offset < start_addr_offset) {
        if (err) {
          (*err) += "Invalid start/end offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (start_addr_offset > length) {
        if (err) {
          (*err) += "Invalid start offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (end_addr_offset > length) {
        if (err) {
          (*err) += "Invalid end offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (asset_size > (options.max_allowed_asset_size_in_mb * 1024ull * 1024ull)) {
        PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] file size too large. {} bytes (max_allowed_asset_size {})",
          i, asset_size, options.max_allowed_asset_size_in_mb * 1024ull * 1024ull));
      }

      DCOUT("Image asset size: " << asset_size);

      {
        nonstd::expected<image::ImageInfoResult, std::string> info =
            image::GetImageInfoFromMemory(asset_addr, asset_size, uri);

        if (info) {
          if (info->width == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Assset no[{}] Image has zero width.", i));
          }

          if (info->width > options.max_image_width) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ, fmt::format("Asset no[{}] Image width too large. {} (max_image_width {})", i, info->width, options.max_image_width));
          }

          if (info->height == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] Image has zero height.", i));
          }

          if (info->height > options.max_image_height) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ,
                fmt::format("Asset no[{}] Image height too large. {} (max_image_height {})", i, info->height, options.max_image_height));
          }

          if (info->channels == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] Image has zero channels.", i));
          }

          if (info->channels > options.max_image_channels) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ,
                fmt::format("Asset no[{}] Image channels too much", i));
          }
        }
      }

      Image image;
      nonstd::expected<image::ImageResult, std::string> ret =
          image::LoadImageFromMemory(asset_addr, asset_size, uri);

      if (!ret) {
        (*err) += ret.error();
      } else {
        image = (*ret).image;
        if (!(*ret).warning.empty()) {
          (*warn) += (*ret).warning;
        }
      }
    } else {
      // TODO: Support other asserts(e.g. audio mp3)
    }
  }
#endif

  return true;
}